

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O3

bool __thiscall
S2CrossingEdgeQuery::VisitCells
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,CellVisitor *visitor)

{
  VType *pVVar1;
  VType VVar2;
  bool bVar3;
  CellRelation CVar4;
  ulong uVar5;
  S2CellId target;
  S2ShapeIndexCell *pSVar6;
  Iterator *this_00;
  long lVar7;
  undefined8 uVar8;
  S2PaddedCell *pSVar9;
  S2PaddedCell *pSVar10;
  long lVar11;
  byte bVar12;
  R2Rect edge_bound;
  S2PaddedCell pcell;
  FaceSegmentVector segments;
  S2CellId local_210;
  R2Rect local_208;
  S2PaddedCell local_1e8;
  S2PaddedCell local_188;
  FaceSegmentVector local_128;
  
  bVar12 = 0;
  this->visitor_ = visitor;
  local_128.allocator_and_tag_.tag_.size_ = (Tag)0;
  S2::GetFaceSegments(a0,a1,&local_128);
  uVar8 = local_128.rep_._8_8_;
  if (((ulong)local_128.allocator_and_tag_.tag_.size_ & 1) == 0) {
    uVar8 = &local_128.rep_;
  }
  bVar3 = true;
  if (1 < (ulong)local_128.allocator_and_tag_.tag_.size_) {
    uVar5 = (ulong)local_128.allocator_and_tag_.tag_.size_ >> 1;
    this_00 = &this->iter_;
    lVar11 = 0;
    do {
      pVVar1 = (VType *)(uVar8 + lVar11 + 8);
      VVar2 = pVVar1[1];
      (this->a0_).c_[0] = *pVVar1;
      (this->a0_).c_[1] = VVar2;
      pVVar1 = (VType *)(uVar8 + lVar11 + 0x18);
      VVar2 = pVVar1[1];
      (this->a1_).c_[0] = *pVVar1;
      (this->a1_).c_[1] = VVar2;
      R2Rect::FromPointPair(&local_208,&this->a0_,&this->a1_);
      S2PaddedCell::S2PaddedCell
                (&local_188,
                 (S2CellId)(((ulong)*(uint *)(uVar8 + lVar11) << 0x3d) + 0x1000000000000000),0.0);
      target = S2PaddedCell::ShrinkToFit(&local_188,&local_208);
      CVar4 = S2ShapeIndex::Iterator::Locate(this_00,target);
      if (CVar4 == SUBDIVIDED) {
        if ((target.id_ & 0xfffffffffffffff) != 0) {
          S2PaddedCell::S2PaddedCell(&local_1e8,target,0.0);
          pSVar9 = &local_1e8;
          pSVar10 = &local_188;
          for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pSVar10->id_).id_ = (pSVar9->id_).id_;
            pSVar9 = (S2PaddedCell *)((long)pSVar9 + (ulong)bVar12 * -0x10 + 8);
            pSVar10 = (S2PaddedCell *)((long)pSVar10 + ((ulong)bVar12 * -2 + 1) * 8);
          }
        }
        bVar3 = VisitCells(this,&local_188,&local_208);
LAB_001e6974:
        if (bVar3 == false) {
          bVar3 = false;
          goto LAB_001e698d;
        }
      }
      else if (CVar4 == INDEXED) {
        local_210.id_ =
             (((this_00->iter_)._M_t.
               super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
               .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_;
        bVar3 = S2CellId::contains(&local_210,target);
        if (!bVar3) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_1e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc"
                     ,0xe4,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8.padding_,"Check failed: iter_.id().contains(edge_root) ",
                     0x2d);
          abort();
        }
        pSVar6 = S2ShapeIndex::Iterator::cell(this_00);
        if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar3 = (*visitor->_M_invoker)((_Any_data *)visitor,pSVar6);
        goto LAB_001e6974;
      }
      lVar11 = lVar11 + 0x28;
    } while (uVar5 * 0x28 != lVar11);
    bVar3 = true;
  }
LAB_001e698d:
  absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::clear(&local_128);
  return bVar3;
}

Assistant:

bool S2CrossingEdgeQuery::VisitCells(const S2Point& a0, const S2Point& a1,
                                     const CellVisitor& visitor) {
  visitor_ = &visitor;
  S2::FaceSegmentVector segments;
  S2::GetFaceSegments(a0, a1, &segments);
  for (const auto& segment : segments) {
    a0_ = segment.a;
    a1_ = segment.b;

    // Optimization: rather than always starting the recursive subdivision at
    // the top level face cell, instead we start at the smallest S2CellId that
    // contains the edge (the "edge root cell").  This typically lets us skip
    // quite a few levels of recursion since most edges are short.
    R2Rect edge_bound = R2Rect::FromPointPair(a0_, a1_);
    S2PaddedCell pcell(S2CellId::FromFace(segment.face), 0);
    S2CellId edge_root = pcell.ShrinkToFit(edge_bound);

    // Now we need to determine how the edge root cell is related to the cells
    // in the spatial index (cell_map_).  There are three cases:
    //
    //  1. edge_root is an index cell or is contained within an index cell.
    //     In this case we only need to look at the contents of that cell.
    //  2. edge_root is subdivided into one or more index cells.  In this case
    //     we recursively subdivide to find the cells intersected by a0a1.
    //  3. edge_root does not intersect any index cells.  In this case there
    //     is nothing to do.
    S2ShapeIndex::CellRelation relation = iter_.Locate(edge_root);
    if (relation == S2ShapeIndex::INDEXED) {
      // edge_root is an index cell or is contained by an index cell (case 1).
      S2_DCHECK(iter_.id().contains(edge_root));
      if (!visitor(iter_.cell())) return false;
    } else if (relation == S2ShapeIndex::SUBDIVIDED) {
      // edge_root is subdivided into one or more index cells (case 2).  We
      // find the cells intersected by a0a1 using recursive subdivision.
      if (!edge_root.is_face()) pcell = S2PaddedCell(edge_root, 0);
      if (!VisitCells(pcell, edge_bound)) return false;
    }
  }
  return true;
}